

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

int tree::truncate(char *__file,__off_t __length)

{
  char *__s;
  int iVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  size_t sVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  wstring str;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  converter;
  wide_string local_e0;
  undefined8 local_c0;
  int *local_b8;
  byte_string local_b0;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  local_90;
  
  uVar5 = *(undefined8 *)(__length + 0x18);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert(&local_90);
  __s = *(char **)(__length + 0x10);
  sVar4 = strlen(__s);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::from_bytes(&local_e0,&local_90,__s,__s + sVar4);
  iVar6 = (int)local_e0._M_string_length + -1;
  if ((int)__file < 3) {
    iVar6 = 1;
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    iVar3 = 0;
    iVar2 = 0;
    local_c0 = uVar5;
    local_b8 = (int *)__length;
    do {
      if (iVar2 < iVar3) {
        uVar8 = (ulong)iVar7;
        if (CONCAT44(local_e0._M_string_length._4_4_,(int)local_e0._M_string_length) <= uVar8) {
LAB_00167be1:
          uVar5 = std::__throw_out_of_range_fmt
                            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                             uVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity * 4 + 4
                           );
          }
          std::__cxx11::
          wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
          ::~wstring_convert(&local_90);
          _Unwind_Resume(uVar5);
        }
        iVar1 = wcwidth(local_e0._M_dataplus._M_p[uVar8]);
        iVar2 = iVar1 + iVar2;
        iVar7 = iVar7 + 1;
      }
      else {
        uVar8 = (ulong)iVar6;
        if (CONCAT44(local_e0._M_string_length._4_4_,(int)local_e0._M_string_length) <= uVar8)
        goto LAB_00167be1;
        iVar1 = wcwidth(local_e0._M_dataplus._M_p[uVar8]);
        iVar3 = iVar1 + iVar3;
        iVar6 = iVar6 + -1;
      }
    } while (iVar3 + iVar2 < (int)__file + -2);
    iVar6 = iVar3 + iVar2 + 1;
    __length = (__off_t)local_b8;
    uVar5 = local_c0;
  }
  std::__cxx11::wstring::erase((ulong)&local_e0,(long)iVar7);
  std::__cxx11::wstring::replace((ulong)&local_e0,(long)iVar7,(wchar_t *)0x0,0x1a4ce4);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::to_bytes(&local_b0,&local_90,local_e0._M_dataplus._M_p,
             local_e0._M_dataplus._M_p +
             CONCAT44(local_e0._M_string_length._4_4_,(int)local_e0._M_string_length));
  std::__cxx11::string::operator=((string *)(__length + 0x10),(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  *(int *)(__length + 0xc) = *(int *)(__length + 0xc) + (*(int *)(__length + 0x18) - (int)uVar5);
  *(int *)(__length + 4) = iVar6 + *(int *)__length;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity * 4 + 4);
  }
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_90);
  return extraout_EAX;
}

Assistant:

void truncate(const int l, Cell &cell)
{
    int old_bytesize = cell.text.size();
    std::wstring_convert<std::codecvt_utf8<wchar_t>, wchar_t> converter;
    std::wstring str = converter.from_bytes(cell.text.c_str());
    int ls = 0, rs = 0;
    int i = 0, j = str.size() - 1;
    while (ls + rs < l - 2) {
        if (ls < rs) {
            ls += wchar_width(str.at(i));
            i++;
        } else {
            rs += wchar_width(str.at(j));
            j--;
        }
    }
    str.erase(i, j - i + 1);
    str.insert(i, L"…");
    // https://stackoverflow.com/questions/4804298/how-to-convert-wstring-into-string
    // use converter (.to_bytes: wstr->str, .from_bytes: str->wstr)
    cell.text = converter.to_bytes(str);
    cell.byte_end -= old_bytesize - cell.text.size();
    cell.col_end -= cell.col_end - cell.col_start - (ls + rs + 1);
}